

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VarIntG8IU.h
# Opt level: O0

void __thiscall
FastPForLib::VarIntG8IU::encodeArray
          (VarIntG8IU *this,uint32_t *in,size_t length,uint32_t *out,size_t *nvalue)

{
  int iVar1;
  undefined1 *in_RCX;
  ulong in_RDX;
  ulong *in_R8;
  bool bVar2;
  size_t compressed_size;
  uchar *dst;
  size_t srclength;
  uint32_t *src;
  long local_48;
  undefined1 *local_40;
  
  *in_R8 = *in_R8 << 2;
  local_48 = 0;
  while( true ) {
    bVar2 = false;
    if ((in_RDX & 0x3fffffffffffffff) != 0) {
      bVar2 = 8 < *in_R8;
    }
    if (!bVar2) break;
    iVar1 = encodeBlock((VarIntG8IU *)length,(uint32_t **)out,nvalue,(uchar **)src,
                        (size_t *)srclength);
    local_48 = iVar1 + local_48;
  }
  *in_R8 = local_48 + 3U >> 2;
  local_40 = in_RCX;
  while (local_40 < in_RCX + *in_R8 * 4) {
    *local_40 = 0;
    local_40 = local_40 + 1;
  }
  return;
}

Assistant:

void encodeArray(const uint32_t *in, const size_t length, uint32_t *out,
                   size_t &nvalue) {
    const uint32_t *src = in;
    size_t srclength = length * 4;

    unsigned char *dst = reinterpret_cast<unsigned char *>(out);
    nvalue = nvalue * 4;

    size_t compressed_size = 0;
    while (srclength > 0 && nvalue >= 9) {
      compressed_size += encodeBlock(src, srclength, dst, nvalue);
    }
    // Output might not be a multiple of 4 so we make it so
    nvalue = ((compressed_size + 3) / 4);
    while (dst < reinterpret_cast<unsigned char*>(out + nvalue)) {
      *dst++ = 0; // clear padding bytes
    }
  }